

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O2

int AlphaVectorPruning::GetVectorIndex
              (AlphaVector *p,ValueFunctionPOMDPDiscrete *uU,
              vector<double,_std::allocator<double>_> *belief)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  pointer pdVar3;
  const_reference pvVar4;
  reference pvVar5;
  Index j;
  size_type __n;
  uint uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint local_84;
  double local_80;
  double local_78;
  AlphaVector curr;
  
  pdVar2 = (p->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = 0;
  local_84 = 0;
  pdVar3 = (p->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78 = INFINITY;
  while( true ) {
    if ((ulong)(((long)(uU->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(uU->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x28) <= (ulong)uVar6) break;
    pvVar4 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at(uU,(ulong)uVar6);
    AlphaVector::AlphaVector(&curr,pvVar4);
    __n = 0;
    local_80 = 0.0;
    while (((ulong)((long)pdVar2 - (long)pdVar3) >> 3 & 0xffffffff) != __n) {
      dVar7 = AlphaVector::GetValue(p,(Index)__n);
      dVar8 = AlphaVector::GetValue(&curr,(Index)__n);
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(belief,__n);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_80;
      __n = __n + 1;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *pvVar5;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar7 - dVar8;
      auVar10 = vfmadd231sd_fma(auVar11,auVar9,auVar1);
      local_80 = auVar10._0_8_;
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_78;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_80;
    auVar10 = vminsd_avx(auVar12,auVar10);
    if (local_80 < local_78) {
      local_84 = uVar6;
    }
    AlphaVector::~AlphaVector(&curr);
    uVar6 = uVar6 + 1;
    local_78 = auVar10._0_8_;
  }
  return local_84;
}

Assistant:

int AlphaVectorPruning::GetVectorIndex(const AlphaVector &p,
                                    const ValueFunctionPOMDPDiscrete &uU,
                                    vector<double> &belief)
{
    double currentMin = std::numeric_limits<double>::infinity();
    Index currentIndex = 0;
    size_t nrStates = p.GetNrValues();

    for(Index i=0; i<uU.size();i++)
    {
        AlphaVector curr = uU.at(i);
        double currentVal = 0.0;

        for(Index j=0; j<nrStates; j++)
        {
            currentVal = currentVal + (p.GetValue(j)-curr.GetValue(j)) * belief.at(j);
        }

        if(currentVal < currentMin) 
        {
            currentMin = currentVal;
            currentIndex = i;
        }
    }

    return currentIndex;
}